

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

Var __thiscall Js::JavascriptStackWalker::GetCurrentArgumentsObject(JavascriptStackWalker *this)

{
  JavascriptStackWalker *this_local;
  
  if (this->interpreterFrame == (InterpreterStackFrame *)0x0) {
    if ((*(ushort *)&this->field_0x50 & 1) == 0) {
      this_local = (JavascriptStackWalker *)GetCurrentNativeArgumentsObject(this);
    }
    else {
      this_local = (JavascriptStackWalker *)
                   InlinedFrameWalker::GetArgumentsObject(&this->inlinedFrameWalker);
    }
  }
  else {
    this_local = (JavascriptStackWalker *)
                 InterpreterStackFrame::GetArgumentsObject(this->interpreterFrame);
  }
  return this_local;
}

Assistant:

Var JavascriptStackWalker::GetCurrentArgumentsObject() const
    {
#if ENABLE_PROFILE_INFO
        if (interpreterFrame)
#else
        Assert(interpreterFrame);
#endif
        {
            return interpreterFrame->GetArgumentsObject();
        }
#if ENABLE_NATIVE_CODEGEN
        else
        {
            if (inlinedFramesBeingWalked)
            {
                return inlinedFrameWalker.GetArgumentsObject();
            }
            else
            {
                return this->GetCurrentNativeArgumentsObject();
            }
        }
#endif
    }